

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_utils.hpp
# Opt level: O2

AlpSamplingParameters duckdb::alp::AlpUtils::GetSamplingParameters(idx_t current_vector_n_values)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  AlpSamplingParameters AVar5;
  
  if (0x3ff < current_vector_n_values) {
    current_vector_n_values = 0x400;
  }
  uVar1 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(current_vector_n_values);
  dVar4 = (double)uVar1;
  dVar3 = ceil(dVar4 * 0.03125);
  uVar2 = 1;
  if (1 < (uint)(long)dVar3) {
    uVar2 = (long)dVar3;
  }
  dVar3 = ceil(dVar4 / (double)(uVar2 & 0xffffffff));
  uVar2 = (uVar2 & 0xffffffff) << 0x20 | (ulong)uVar1;
  AVar5.n_sampled_values = (uint32_t)(long)dVar3;
  AVar5.n_lookup_values = (int)uVar2;
  AVar5.n_sampled_increments = (int)(uVar2 >> 0x20);
  return AVar5;
}

Assistant:

static AlpSamplingParameters GetSamplingParameters(idx_t current_vector_n_values) {

		auto n_lookup_values =
		    NumericCast<uint32_t>(MinValue(current_vector_n_values, (idx_t)AlpConstants::ALP_VECTOR_SIZE));
		//! We sample equidistant values within a vector; to do this we jump a fixed number of values
		uint32_t n_sampled_increments = MaxValue<uint32_t>(
		    1, ExactNumericCast<uint32_t>(std::ceil((double)n_lookup_values / AlpConstants::SAMPLES_PER_VECTOR)));
		uint32_t n_sampled_values =
		    ExactNumericCast<uint32_t>(std::ceil((double)n_lookup_values / n_sampled_increments));
		D_ASSERT(n_sampled_values < AlpConstants::ALP_VECTOR_SIZE);

		AlpSamplingParameters sampling_params = {n_lookup_values, n_sampled_increments, n_sampled_values};
		return sampling_params;
	}